

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O2

wchar_t zip_read_data_deflate(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  zip *zip;
  uLong uVar1;
  zip_entry *pzVar2;
  int error_number;
  wchar_t wVar3;
  uint uVar4;
  uchar *puVar5;
  Bytef *pBVar6;
  uint32_t *puVar7;
  char *fmt;
  ssize_t bytes_avail;
  
  zip = (zip *)a->format->data;
  if (zip->uncompressed_buffer == (uchar *)0x0) {
    zip->uncompressed_buffer_size = 0x40000;
    puVar5 = (uchar *)malloc(0x40000);
    zip->uncompressed_buffer = puVar5;
    if (puVar5 != (uchar *)0x0) goto LAB_00131ffe;
    fmt = "No memory for ZIP decompression";
LAB_0013219b:
    error_number = 0xc;
  }
  else {
LAB_00131ffe:
    wVar3 = zip_deflate_init(a,zip);
    if (wVar3 != L'\0') {
      return wVar3;
    }
    pBVar6 = (Bytef *)__archive_read_ahead(a,1,&bytes_avail);
    if (((zip->entry->zip_flags & 8) == 0) && (zip->entry_bytes_remaining < bytes_avail)) {
      bytes_avail = zip->entry_bytes_remaining;
    }
    if (bytes_avail < 1) {
      fmt = "Truncated ZIP file body";
    }
    else {
      (zip->stream).next_in = pBVar6;
      (zip->stream).avail_in = (uInt)bytes_avail;
      (zip->stream).total_in = 0;
      (zip->stream).next_out = zip->uncompressed_buffer;
      (zip->stream).avail_out = (uInt)zip->uncompressed_buffer_size;
      (zip->stream).total_out = 0;
      uVar4 = inflate(&zip->stream,0);
      if (uVar4 == 0xfffffffc) {
        fmt = "Out of memory for ZIP decompression";
        goto LAB_0013219b;
      }
      if (uVar4 != 0) {
        if (uVar4 != 1) {
          archive_set_error(&a->archive,-1,"ZIP decompression failed (%d)",(ulong)uVar4);
          return L'\xffffffe2';
        }
        zip->end_of_entry = '\x01';
      }
      bytes_avail = (zip->stream).total_in;
      __archive_read_consume(a,bytes_avail);
      zip->entry_bytes_remaining = zip->entry_bytes_remaining - bytes_avail;
      zip->entry_compressed_bytes_read = zip->entry_compressed_bytes_read + bytes_avail;
      uVar1 = (zip->stream).total_out;
      *size = uVar1;
      zip->entry_uncompressed_bytes_read = zip->entry_uncompressed_bytes_read + uVar1;
      *buff = zip->uncompressed_buffer;
      if (zip->end_of_entry == '\0') {
        return L'\0';
      }
      if ((zip->entry->zip_flags & 8) == 0) {
        return L'\0';
      }
      puVar7 = (uint32_t *)__archive_read_ahead(a,0x18,(ssize_t *)0x0);
      if (puVar7 != (uint32_t *)0x0) {
        if (((((char)*puVar7 == 'P') && (*(char *)((long)puVar7 + 1) == 'K')) &&
            (*(char *)((long)puVar7 + 2) == '\a')) && (*(char *)((long)puVar7 + 3) == '\b')) {
          puVar7 = puVar7 + 1;
          zip->unconsumed = 4;
        }
        pzVar2 = zip->entry;
        pzVar2->crc32 = *puVar7;
        if ((pzVar2->flags & 1) == 0) {
          pzVar2->compressed_size = (ulong)puVar7[1];
          pzVar2->uncompressed_size = (ulong)puVar7[2];
          zip->unconsumed = zip->unconsumed + 0xc;
        }
        else {
          pzVar2->compressed_size = *(int64_t *)(puVar7 + 1);
          pzVar2->uncompressed_size = *(int64_t *)(puVar7 + 3);
          zip->unconsumed = zip->unconsumed + 0x14;
        }
        return L'\0';
      }
      fmt = "Truncated ZIP end-of-file record";
    }
    error_number = 0x54;
  }
  archive_set_error(&a->archive,error_number,fmt);
  return L'\xffffffe2';
}

Assistant:

static int
zip_read_data_deflate(struct archive_read *a, const void **buff,
    size_t *size, int64_t *offset)
{
	struct zip *zip;
	ssize_t bytes_avail;
	const void *compressed_buff;
	int r;

	(void)offset; /* UNUSED */

	zip = (struct zip *)(a->format->data);

	/* If the buffer hasn't been allocated, allocate it now. */
	if (zip->uncompressed_buffer == NULL) {
		zip->uncompressed_buffer_size = 256 * 1024;
		zip->uncompressed_buffer
		    = (unsigned char *)malloc(zip->uncompressed_buffer_size);
		if (zip->uncompressed_buffer == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "No memory for ZIP decompression");
			return (ARCHIVE_FATAL);
		}
	}

	r = zip_deflate_init(a, zip);
	if (r != ARCHIVE_OK)
		return (r);

	/*
	 * Note: '1' here is a performance optimization.
	 * Recall that the decompression layer returns a count of
	 * available bytes; asking for more than that forces the
	 * decompressor to combine reads by copying data.
	 */
	compressed_buff = __archive_read_ahead(a, 1, &bytes_avail);
	if (0 == (zip->entry->zip_flags & ZIP_LENGTH_AT_END)
	    && bytes_avail > zip->entry_bytes_remaining) {
		bytes_avail = (ssize_t)zip->entry_bytes_remaining;
	}
	if (bytes_avail <= 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated ZIP file body");
		return (ARCHIVE_FATAL);
	}

	/*
	 * A bug in zlib.h: stream.next_in should be marked 'const'
	 * but isn't (the library never alters data through the
	 * next_in pointer, only reads it).  The result: this ugly
	 * cast to remove 'const'.
	 */
	zip->stream.next_in = (Bytef *)(uintptr_t)(const void *)compressed_buff;
	zip->stream.avail_in = (uInt)bytes_avail;
	zip->stream.total_in = 0;
	zip->stream.next_out = zip->uncompressed_buffer;
	zip->stream.avail_out = (uInt)zip->uncompressed_buffer_size;
	zip->stream.total_out = 0;

	r = inflate(&zip->stream, 0);
	switch (r) {
	case Z_OK:
		break;
	case Z_STREAM_END:
		zip->end_of_entry = 1;
		break;
	case Z_MEM_ERROR:
		archive_set_error(&a->archive, ENOMEM,
		    "Out of memory for ZIP decompression");
		return (ARCHIVE_FATAL);
	default:
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "ZIP decompression failed (%d)", r);
		return (ARCHIVE_FATAL);
	}

	/* Consume as much as the compressor actually used. */
	bytes_avail = zip->stream.total_in;
	__archive_read_consume(a, bytes_avail);
	zip->entry_bytes_remaining -= bytes_avail;
	zip->entry_compressed_bytes_read += bytes_avail;

	*size = zip->stream.total_out;
	zip->entry_uncompressed_bytes_read += zip->stream.total_out;
	*buff = zip->uncompressed_buffer;

	if (zip->end_of_entry && (zip->entry->zip_flags & ZIP_LENGTH_AT_END)) {
		const char *p;

		if (NULL == (p = __archive_read_ahead(a, 24, NULL))) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated ZIP end-of-file record");
			return (ARCHIVE_FATAL);
		}
		/* Consume the optional PK\007\010 marker. */
		if (p[0] == 'P' && p[1] == 'K' &&
		    p[2] == '\007' && p[3] == '\010') {
			p += 4;
			zip->unconsumed = 4;
		}
		if (zip->entry->flags & LA_USED_ZIP64) {
			zip->entry->crc32 = archive_le32dec(p);
			zip->entry->compressed_size = archive_le64dec(p + 4);
			zip->entry->uncompressed_size = archive_le64dec(p + 12);
			zip->unconsumed += 20;
		} else {
			zip->entry->crc32 = archive_le32dec(p);
			zip->entry->compressed_size = archive_le32dec(p + 4);
			zip->entry->uncompressed_size = archive_le32dec(p + 8);
			zip->unconsumed += 12;
		}
	}

	return (ARCHIVE_OK);
}